

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O2

void __thiscall
ParserProbModelXML::ConvertToLocalSFActionScope
          (ParserProbModelXML *this,Index sfI,Index aI,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *AValues,Scope *AScope)

{
  pointer puVar1;
  reference __x;
  reference __x_00;
  size_t i;
  ulong uVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> allAValues;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  __x = std::vector<Scope,_std::allocator<Scope>_>::at(&this->_m_AScopes_Y,(ulong)sfI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&AScope->super_SDT,&__x->super_SDT);
  IndexTools::JointToIndividualIndices
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40,aI,&this->_m_ASizes);
  puVar1 = (AValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((AValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (AValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  for (uVar2 = 0;
      puVar1 = (AScope->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(AScope->super_SDT).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)puVar1 >> 2);
      uVar2 = uVar2 + 1) {
    __x_00 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40,
                        (ulong)puVar1[uVar2]);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(AValues,__x_00);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

void ParserProbModelXML::ConvertToLocalSFActionScope(Index sfI, Index aI, vector<Index>& AValues, Scope& AScope)
{
    try{
        AScope = _m_AScopes_Y.at(sfI);
    }
    catch(E& e)
    {
        e.Print();
    }
        
    vector<Index> allAValues = IndexTools::JointToIndividualIndices(aI, _m_ASizes);
    AValues.clear();
    for(size_t i = 0; i < AScope.size(); i++)
        AValues.push_back(allAValues.at(AScope[i]));
}